

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O0

void ly_free_prefix_data(LY_VALUE_FORMAT format,void *prefix_data)

{
  ulong local_50;
  ulong local_38;
  uint64_t u;
  uint32_t i;
  lysc_prefix *prefixes;
  ly_set *ns_list;
  void *prefix_data_local;
  LY_VALUE_FORMAT format_local;
  
  if ((prefix_data != (void *)0x0) && (LY_VALUE_SCHEMA < format)) {
    if (format == LY_VALUE_SCHEMA_RESOLVED) {
      local_38 = 0;
      while( true ) {
        if (prefix_data == (void *)0x0) {
          local_50 = 0;
        }
        else {
          local_50 = *(ulong *)((long)prefix_data + -8);
        }
        if (local_50 <= local_38) break;
        free(*(void **)((long)prefix_data + local_38 * 0x10));
        local_38 = local_38 + 1;
      }
      if (prefix_data != (void *)0x0) {
        free((void *)((long)prefix_data + -8));
      }
    }
    else if ((format == LY_VALUE_XML) ||
            ((1 < format - LY_VALUE_JSON && (format == LY_VALUE_STR_NS)))) {
      for (u._4_4_ = 0; u._4_4_ < *(uint *)((long)prefix_data + 4); u._4_4_ = u._4_4_ + 1) {
        free((void *)**(undefined8 **)(*(long *)((long)prefix_data + 8) + (ulong)u._4_4_ * 8));
        free(*(void **)(*(long *)(*(long *)((long)prefix_data + 8) + (ulong)u._4_4_ * 8) + 8));
      }
      ly_set_free((ly_set *)prefix_data,free);
    }
  }
  return;
}

Assistant:

void
ly_free_prefix_data(LY_VALUE_FORMAT format, void *prefix_data)
{
    struct ly_set *ns_list;
    struct lysc_prefix *prefixes;
    uint32_t i;
    LY_ARRAY_COUNT_TYPE u;

    if (!prefix_data) {
        return;
    }

    switch (format) {
    case LY_VALUE_XML:
    case LY_VALUE_STR_NS:
        ns_list = prefix_data;
        for (i = 0; i < ns_list->count; ++i) {
            free(((struct lyxml_ns *)ns_list->objs[i])->prefix);
            free(((struct lyxml_ns *)ns_list->objs[i])->uri);
        }
        ly_set_free(ns_list, free);
        break;
    case LY_VALUE_SCHEMA_RESOLVED:
        prefixes = prefix_data;
        LY_ARRAY_FOR(prefixes, u) {
            free(prefixes[u].prefix);
        }
        LY_ARRAY_FREE(prefixes);
        break;
    case LY_VALUE_CANON:
    case LY_VALUE_SCHEMA:
    case LY_VALUE_JSON:
    case LY_VALUE_LYB:
        break;
    }
}